

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

void data_sheet_expat_callback_find_value_end(void *callbackdata,XML_Char *name)

{
  int iVar1;
  
  iVar1 = XML_Char_icmp_ins(name,"v");
  if (iVar1 != 0) {
    iVar1 = XML_Char_icmp_ins(name,"t");
    if (iVar1 != 0) {
      iVar1 = XML_Char_icmp_ins(name,"is");
      if (iVar1 != 0) {
        data_sheet_expat_callback_find_row_end(callbackdata,name);
        return;
      }
      *(undefined4 *)((long)callbackdata + 0x40) = 0;
      return;
    }
  }
  XML_SetElementHandler
            (*callbackdata,data_sheet_expat_callback_find_value_start,
             data_sheet_expat_callback_find_cell_end);
  XML_SetCharacterDataHandler(*callbackdata,0);
  return;
}

Assistant:

void data_sheet_expat_callback_find_value_end (void* callbackdata, const XML_Char* name)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("v")) == 0 || XML_Char_icmp_ins(name, X("t")) == 0) {
    XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_find_value_start, data_sheet_expat_callback_find_cell_end);
    XML_SetCharacterDataHandler(data->xmlparser, NULL);
  } else if (XML_Char_icmp_ins(name, X("is")) == 0) {
    data->cell_string_type = none;
  } else {
    data_sheet_expat_callback_find_row_end(callbackdata, name);
  }
}